

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O1

void Llb_Nonlin4SweepDeref(DdManager *dd,Vec_Ptr_t *vParts)

{
  long lVar1;
  
  if (0 < vParts->nSize) {
    lVar1 = 0;
    do {
      Cudd_RecursiveDeref(dd,(DdNode *)vParts->pArray[lVar1]);
      lVar1 = lVar1 + 1;
    } while (lVar1 < vParts->nSize);
  }
  if (vParts->pArray != (void **)0x0) {
    free(vParts->pArray);
    vParts->pArray = (void **)0x0;
  }
  if (vParts != (Vec_Ptr_t *)0x0) {
    free(vParts);
    return;
  }
  return;
}

Assistant:

void Llb_Nonlin4SweepDeref( DdManager * dd, Vec_Ptr_t * vParts )
{
    DdNode * bFunc;
    int i;
    Vec_PtrForEachEntry( DdNode *, vParts, bFunc, i )
        Cudd_RecursiveDeref( dd, bFunc );
    Vec_PtrFree( vParts );
}